

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_radio_text(nk_context *ctx,char *text,int len,int *active)

{
  int is_active;
  int iVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4fc8,"int nk_radio_text(struct nk_context *, const char *, int, int *)");
  }
  if (text != (char *)0x0) {
    if (active != (int *)0x0) {
      is_active = *active;
      iVar1 = nk_option_text(ctx,text,len,is_active);
      *active = iVar1;
      return (int)(is_active != iVar1);
    }
    __assert_fail("active",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4fca,"int nk_radio_text(struct nk_context *, const char *, int, int *)");
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x4fc9,"int nk_radio_text(struct nk_context *, const char *, int, int *)");
}

Assistant:

NK_API int
nk_radio_text(struct nk_context *ctx, const char *text, int len, int *active)
{
    int old_value;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    NK_ASSERT(active);
    if (!ctx || !text || !active) return 0;
    old_value = *active;
    *active = nk_option_text(ctx, text, len, old_value);
    return old_value != *active;
}